

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

string * __thiscall
chaiscript::detail::Dispatch_Engine::get_type_name_abi_cxx11_
          (string *__return_storage_ptr__,Dispatch_Engine *this,Type_Info *ti)

{
  bool bVar1;
  _Base_ptr p_Var2;
  char *__s;
  allocator<char> local_21;
  
  p_Var2 = (this->m_state).m_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(this->m_state).m_types._M_t._M_impl.super__Rb_tree_header) {
      __s = Type_Info::bare_name(ti);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,&local_21);
      return __return_storage_ptr__;
    }
    bVar1 = Type_Info::bare_equal((Type_Info *)(p_Var2 + 2),ti);
    if (bVar1) break;
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1));
  return __return_storage_ptr__;
}

Assistant:

std::string get_type_name(const Type_Info &ti) const {
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        for (const auto &elem : m_state.m_types) {
          if (elem.second.bare_equal(ti)) {
            return elem.first;
          }
        }

        return ti.bare_name();
      }